

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall
Application::onMessage(Application *this,MarketDataRequest *message,SessionID *param_2)

{
  char cVar1;
  int iVar2;
  IncorrectTagValue *this_00;
  uint num;
  Symbol symbol;
  SubscriptionRequestType subscriptionRequestType;
  NoRelatedSym noRelatedSym;
  MarketDepth marketDepth;
  MDReqID mdReqID;
  NoRelatedSym noRelatedSymGroup;
  FieldBase local_260;
  FieldBase local_208;
  FieldBase local_1b0;
  FieldBase local_158;
  FieldBase local_100;
  Group local_a8;
  
  FIX::StringField::StringField((StringField *)&local_100,0x106);
  local_100._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b680;
  FIX::CharField::CharField((CharField *)&local_208,0x107);
  local_208._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b6b8;
  FIX::IntField::IntField((IntField *)&local_158,0x108);
  local_158._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b6f0;
  FIX::IntField::IntField((IntField *)&local_1b0,0x92);
  local_1b0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b760;
  FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&local_a8);
  FIX::FieldMap::getField((FieldMap *)message,&local_100);
  FIX::FieldMap::getField((FieldMap *)message,&local_208);
  cVar1 = FIX::CharField::getValue((CharField *)&local_208);
  if (cVar1 == '0') {
    FIX::FieldMap::getField((FieldMap *)message,&local_158);
    FIX::FieldMap::getField((FieldMap *)message,&local_1b0);
    num = 1;
    while( true ) {
      iVar2 = FIX::IntField::getValue((IntField *)&local_1b0);
      if (iVar2 < (int)num) break;
      FIX::StringField::StringField((StringField *)&local_260,0x37);
      local_260._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b408;
      FIX::Message::getGroup((Message *)message,num,&local_a8);
      FIX::FieldMap::getField(&local_a8.super_FieldMap,&local_260);
      FIX::FieldBase::~FieldBase(&local_260);
      num = num + 1;
    }
    FIX::FieldMap::~FieldMap(&local_a8.super_FieldMap);
    FIX::FieldBase::~FieldBase(&local_1b0);
    FIX::FieldBase::~FieldBase(&local_158);
    FIX::FieldBase::~FieldBase(&local_208);
    FIX::FieldBase::~FieldBase(&local_100);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  local_260._vptr_FieldBase = (_func_int **)&local_260.m_string;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  FIX::IncorrectTagValue::IncorrectTagValue(this_00,local_208.m_tag,(string *)&local_260);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}